

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core.cc
# Opt level: O3

int WebRtcAecm_InitCore(AecmCore *aecm,int samplingFreq)

{
  int16_t *piVar1;
  int32_t *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  iVar7 = -1;
  if ((samplingFreq == 16000) || (samplingFreq == 8000)) {
    aecm->mult = (int16_t)((uint)(((ulong)(uint)samplingFreq & 0xffff) >> 6) / 0x7d);
    aecm->farBufWritePos = 0;
    aecm->farBufReadPos = 0;
    aecm->knownDelay = 0;
    aecm->lastKnownDelay = 0;
    WebRtc_InitBuffer(aecm->farFrameBuf);
    WebRtc_InitBuffer(aecm->nearNoisyFrameBuf);
    WebRtc_InitBuffer(aecm->nearCleanFrameBuf);
    WebRtc_InitBuffer(aecm->outFrameBuf);
    memset(aecm->xBuf_buf,0,0x3f0);
    aecm->seed = 0x29a;
    aecm->totCount = 0;
    iVar6 = WebRtc_InitDelayEstimatorFarend(aecm->delay_estimator_farend);
    if ((iVar6 == 0) && (iVar6 = WebRtc_InitDelayEstimator(aecm->delay_estimator), iVar6 == 0)) {
      memset(aecm->far_history,0,13000);
      memset(aecm->far_q_domains,0,400);
      aecm->far_history_pos = 100;
      aecm->nlpFlag = 1;
      aecm->fixedDelay = -1;
      memset(&aecm->dfaCleanQDomain,0,0x18a);
      if (samplingFreq == 8000) {
        memcpy(aecm->channelStored,kChannelStored8kHz,0x82);
        memcpy(aecm->channelAdapt16,kChannelStored8kHz,0x82);
        piVar1 = aecm->channelAdapt16;
        piVar2 = aecm->channelAdapt32;
        lVar8 = 0;
        do {
          piVar2[lVar8] = (uint)(ushort)piVar1[lVar8] << 0x10;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x41);
      }
      else {
        memcpy(aecm->channelStored,kChannelStored16kHz,0x82);
        memcpy(aecm->channelAdapt16,kChannelStored16kHz,0x82);
        piVar1 = aecm->channelAdapt16;
        piVar2 = aecm->channelAdapt32;
        lVar8 = 0;
        do {
          piVar2[lVar8] = (uint)(ushort)piVar1[lVar8] << 0x10;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x41);
      }
      aecm->mseAdaptOld = 1000;
      aecm->mseStoredOld = 1000;
      aecm->mseThreshold = 0x7fffffff;
      lVar8 = 0;
      aecm->mseChannelCount = 0;
      aecm->noiseEstCtr = 0;
      memset(aecm->echoFilt,0,0x186);
      aecm->cngMode = 1;
      memset(aecm->noiseEstTooLowCtr,0,0x208);
      iVar7 = 0x1081;
      do {
        *(int *)((long)aecm->noiseEst + lVar8 * 2) = iVar7 << 8;
        auVar5 = _DAT_0019dd50;
        auVar4 = _DAT_0019dd40;
        auVar3 = _DAT_0019c620;
        iVar7 = iVar7 + (int)lVar8 + -0x81;
        lVar8 = lVar8 + 2;
      } while (lVar8 != 0x3e);
      lVar8 = 0;
      do {
        auVar9._8_4_ = (int)lVar8;
        auVar9._0_8_ = lVar8;
        auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar10 = (auVar9 | auVar5) ^ auVar3;
        if (auVar10._4_4_ == -0x80000000 && auVar10._0_4_ < -0x7fffffde) {
          aecm->noiseEst[lVar8 + 0x1f] = 0x48400;
          aecm->noiseEst[lVar8 + 0x20] = 0x48400;
        }
        auVar9 = (auVar9 | auVar4) ^ auVar3;
        if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fffffde) {
          aecm->noiseEstTooLowCtr[lVar8 + -0x20] = 0x48400;
          aecm->noiseEstTooLowCtr[lVar8 + -0x1f] = 0x48400;
        }
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x24);
      aecm->farEnergyMin = 0x7fff;
      aecm->farEnergyMax = -0x8000;
      aecm->farEnergyMaxMin = 0;
      aecm->farEnergyVAD = 0x401;
      aecm->farEnergyMSE = 0;
      aecm->currentVADValue = 0;
      aecm->vadUpdateCount = 0;
      aecm->startupState = 0;
      aecm->firstVAD = 1;
      aecm->supGain = 0x100;
      aecm->supGainOld = 0x100;
      aecm->supGainErrParamA = 0xc00;
      aecm->supGainErrParamD = 0x100;
      aecm->supGainErrParamDiffAB = 0x600;
      aecm->supGainErrParamDiffBD = 0x500;
      WebRtcAecm_CalcLinearEnergies = CalcLinearEnergiesC;
      WebRtcAecm_StoreAdaptiveChannel = StoreAdaptiveChannelC;
      WebRtcAecm_ResetAdaptiveChannel = ResetAdaptiveChannelC;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int WebRtcAecm_InitCore(AecmCore* const aecm, int samplingFreq) {
    int i = 0;
    int32_t tmp32 = PART_LEN1 * PART_LEN1;
    int16_t tmp16 = PART_LEN1;

    if (samplingFreq != 8000 && samplingFreq != 16000)
    {
        samplingFreq = 8000;
        return -1;
    }
    // sanity check of sampling frequency
    aecm->mult = (int16_t)samplingFreq / 8000;

    aecm->farBufWritePos = 0;
    aecm->farBufReadPos = 0;
    aecm->knownDelay = 0;
    aecm->lastKnownDelay = 0;

    WebRtc_InitBuffer(aecm->farFrameBuf);
    WebRtc_InitBuffer(aecm->nearNoisyFrameBuf);
    WebRtc_InitBuffer(aecm->nearCleanFrameBuf);
    WebRtc_InitBuffer(aecm->outFrameBuf);

    memset(aecm->xBuf_buf, 0, sizeof(aecm->xBuf_buf));
    memset(aecm->dBufClean_buf, 0, sizeof(aecm->dBufClean_buf));
    memset(aecm->dBufNoisy_buf, 0, sizeof(aecm->dBufNoisy_buf));
    memset(aecm->outBuf_buf, 0, sizeof(aecm->outBuf_buf));

    aecm->seed = 666;
    aecm->totCount = 0;

    if (WebRtc_InitDelayEstimatorFarend(aecm->delay_estimator_farend) != 0) {
      return -1;
    }
    if (WebRtc_InitDelayEstimator(aecm->delay_estimator) != 0) {
      return -1;
    }
    // Set far end histories to zero
    memset(aecm->far_history, 0, sizeof(uint16_t) * PART_LEN1 * MAX_DELAY);
    memset(aecm->far_q_domains, 0, sizeof(int) * MAX_DELAY);
    aecm->far_history_pos = MAX_DELAY;

    aecm->nlpFlag = 1;
    aecm->fixedDelay = -1;

    aecm->dfaCleanQDomain = 0;
    aecm->dfaCleanQDomainOld = 0;
    aecm->dfaNoisyQDomain = 0;
    aecm->dfaNoisyQDomainOld = 0;

    memset(aecm->nearLogEnergy, 0, sizeof(aecm->nearLogEnergy));
    aecm->farLogEnergy = 0;
    memset(aecm->echoAdaptLogEnergy, 0, sizeof(aecm->echoAdaptLogEnergy));
    memset(aecm->echoStoredLogEnergy, 0, sizeof(aecm->echoStoredLogEnergy));

    // Initialize the echo channels with a stored shape.
    if (samplingFreq == 8000)
    {
        WebRtcAecm_InitEchoPathCore(aecm, kChannelStored8kHz);
    }
    else
    {
        WebRtcAecm_InitEchoPathCore(aecm, kChannelStored16kHz);
    }

    memset(aecm->echoFilt, 0, sizeof(aecm->echoFilt));
    memset(aecm->nearFilt, 0, sizeof(aecm->nearFilt));
    aecm->noiseEstCtr = 0;

    aecm->cngMode = AecmTrue;

    memset(aecm->noiseEstTooLowCtr, 0, sizeof(aecm->noiseEstTooLowCtr));
    memset(aecm->noiseEstTooHighCtr, 0, sizeof(aecm->noiseEstTooHighCtr));
    // Shape the initial noise level to an approximate pink noise.
    for (i = 0; i < (PART_LEN1 >> 1) - 1; i++)
    {
        aecm->noiseEst[i] = (tmp32 << 8);
        tmp16--;
        tmp32 -= (int32_t)((tmp16 << 1) + 1);
    }
    for (; i < PART_LEN1; i++)
    {
        aecm->noiseEst[i] = (tmp32 << 8);
    }

    aecm->farEnergyMin = WEBRTC_SPL_WORD16_MAX;
    aecm->farEnergyMax = WEBRTC_SPL_WORD16_MIN;
    aecm->farEnergyMaxMin = 0;
    aecm->farEnergyVAD = FAR_ENERGY_MIN; // This prevents false speech detection at the
                                         // beginning.
    aecm->farEnergyMSE = 0;
    aecm->currentVADValue = 0;
    aecm->vadUpdateCount = 0;
    aecm->firstVAD = 1;

    aecm->startupState = 0;
    aecm->supGain = SUPGAIN_DEFAULT;
    aecm->supGainOld = SUPGAIN_DEFAULT;

    aecm->supGainErrParamA = SUPGAIN_ERROR_PARAM_A;
    aecm->supGainErrParamD = SUPGAIN_ERROR_PARAM_D;
    aecm->supGainErrParamDiffAB = SUPGAIN_ERROR_PARAM_A - SUPGAIN_ERROR_PARAM_B;
    aecm->supGainErrParamDiffBD = SUPGAIN_ERROR_PARAM_B - SUPGAIN_ERROR_PARAM_D;

    // Assert a preprocessor definition at compile-time. It's an assumption
    // used in assembly code, so check the assembly files before any change.
    static_assert(PART_LEN % 16 == 0, "PART_LEN is not a multiple of 16");

    // Initialize function pointers.
    WebRtcAecm_CalcLinearEnergies = CalcLinearEnergiesC;
    WebRtcAecm_StoreAdaptiveChannel = StoreAdaptiveChannelC;
    WebRtcAecm_ResetAdaptiveChannel = ResetAdaptiveChannelC;

#ifdef WEBRTC_DETECT_NEON
    uint64_t features = WebRtc_GetCPUFeaturesARM();
    if ((features & kCPUFeatureNEON) != 0)
    {
      WebRtcAecm_InitNeon();
    }
#elif defined(WEBRTC_HAS_NEON)
    WebRtcAecm_InitNeon();
#endif

#if defined(MIPS32_LE)
    WebRtcAecm_InitMips();
#endif
    return 0;
}